

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall perfetto::internal::TracingMuxerImpl::ConsumerImpl::OnConnect(ConsumerImpl *this)

{
  GetTraceStatsCallback *pGVar1;
  _Manager_type *pp_Var2;
  ConsumerEndpoint *pCVar3;
  _Manager_type p_Var4;
  type callback;
  ScopedFile local_7c;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  _Any_data local_38;
  _Manager_type local_28;
  _Invoker_type local_20;
  
  this->connected_ = true;
  pCVar3 = (this->service_)._M_t.
           super___uniq_ptr_impl<perfetto::ConsumerEndpoint,_std::default_delete<perfetto::ConsumerEndpoint>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::ConsumerEndpoint_*,_std::default_delete<perfetto::ConsumerEndpoint>_>
           .super__Head_base<0UL,_perfetto::ConsumerEndpoint_*,_false>._M_head_impl;
  (*pCVar3->_vptr_ConsumerEndpoint[0xc])(pCVar3,3);
  if ((this->trace_config_).
      super___shared_ptr<perfetto::protos::gen::TraceConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_7c.t_ = -1;
    SetupTracingSession(this->muxer_,this->session_id_,&this->trace_config_,&local_7c);
    base::
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::reset(&local_7c,-1);
  }
  if (this->start_pending_ == true) {
    StartTracingSession(this->muxer_,this->session_id_);
  }
  if (this->get_trace_stats_pending_ == true) {
    pGVar1 = &this->get_trace_stats_callback_;
    local_78._M_unused._M_object = (void *)0x0;
    local_78._8_8_ = 0;
    local_68 = (_Manager_type)0x0;
    p_Stack_60 = (_Invoker_type)(this->get_trace_stats_callback_)._M_invoker;
    pp_Var2 = &(this->get_trace_stats_callback_).super__Function_base._M_manager;
    p_Var4 = (this->get_trace_stats_callback_).super__Function_base._M_manager;
    if (p_Var4 != (_Manager_type)0x0) {
      local_78._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(pGVar1->super__Function_base)._M_functor;
      local_78._8_8_ =
           *(undefined8 *)
            ((long)&(this->get_trace_stats_callback_).super__Function_base._M_functor + 8);
      *pp_Var2 = (_Manager_type)0x0;
      (this->get_trace_stats_callback_)._M_invoker = (_Invoker_type)0x0;
      local_68 = p_Var4;
    }
    if (*pp_Var2 != (_Manager_type)0x0) {
      (**pp_Var2)((_Any_data *)pGVar1,(_Any_data *)pGVar1,__destroy_functor);
      *pp_Var2 = (_Manager_type)0x0;
      (this->get_trace_stats_callback_)._M_invoker = (_Invoker_type)0x0;
    }
    local_38._M_unused._M_object = (void *)0x0;
    local_38._8_8_ = 0;
    local_28 = (_Manager_type)0x0;
    local_20 = p_Stack_60;
    if (local_68 != (_Manager_type)0x0) {
      local_38._M_unused._M_object = local_78._M_unused._M_object;
      local_38._8_8_ = local_78._8_8_;
      local_28 = local_68;
      local_68 = (_Manager_type)0x0;
      p_Stack_60 = (_Invoker_type)0x0;
    }
    GetTraceStats(this->muxer_,this->session_id_,(GetTraceStatsCallback *)&local_38);
    if (local_28 != (_Manager_type)0x0) {
      (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    }
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  p_Var4 = (this->query_service_state_callback_).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_40 = (this->query_service_state_callback_)._M_invoker;
    local_78._M_unused._0_8_ =
         (undefined8)
         *(undefined8 *)&(this->query_service_state_callback_).super__Function_base._M_functor;
    local_78._8_8_ =
         *(undefined8 *)
          ((long)&(this->query_service_state_callback_).super__Function_base._M_functor + 8);
    (this->query_service_state_callback_).super__Function_base._M_manager = (_Manager_type)0x0;
    (this->query_service_state_callback_)._M_invoker = (_Invoker_type)0x0;
    local_48 = (_Manager_type)0x0;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_68 = p_Var4;
    p_Stack_60 = local_40;
    if (p_Var4 != (_Manager_type)0x0) {
      local_58._M_unused._0_8_ =
           (undefined8)
           *(undefined8 *)&(this->query_service_state_callback_).super__Function_base._M_functor;
      local_58._8_8_ =
           *(undefined8 *)
            ((long)&(this->query_service_state_callback_).super__Function_base._M_functor + 8);
      local_68 = (_Manager_type)0x0;
      p_Stack_60 = (_Invoker_type)0x0;
      local_48 = p_Var4;
    }
    QueryServiceState(this->muxer_,this->session_id_,(QueryServiceStateCallback *)&local_58);
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    }
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)(&local_78,&local_78,__destroy_functor);
    }
  }
  if (this->stop_pending_ == true) {
    StopTracingSession(this->muxer_,this->session_id_);
  }
  return;
}

Assistant:

void TracingMuxerImpl::ConsumerImpl::OnConnect() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(!connected_);
  connected_ = true;

  // Observe data source instance events so we get notified when tracing starts.
  service_->ObserveEvents(ObservableEvents::TYPE_DATA_SOURCES_INSTANCES |
                          ObservableEvents::TYPE_ALL_DATA_SOURCES_STARTED);

  // If the API client configured and started tracing before we connected,
  // tell the backend about it now.
  if (trace_config_)
    muxer_->SetupTracingSession(session_id_, trace_config_);
  if (start_pending_)
    muxer_->StartTracingSession(session_id_);
  if (get_trace_stats_pending_) {
    auto callback = std::move(get_trace_stats_callback_);
    get_trace_stats_callback_ = nullptr;
    muxer_->GetTraceStats(session_id_, std::move(callback));
  }
  if (query_service_state_callback_) {
    auto callback = std::move(query_service_state_callback_);
    query_service_state_callback_ = nullptr;
    muxer_->QueryServiceState(session_id_, std::move(callback));
  }
  if (stop_pending_)
    muxer_->StopTracingSession(session_id_);
}